

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O2

void __thiscall qclab::qgates::CZ<double>::CZ(CZ<double> *this)

{
  (this->super_QControlledGate2<double>).control_ = 0;
  (this->super_QControlledGate2<double>).controlState_ = 1;
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004d00e8;
  std::make_unique<qclab::qgates::PauliZ<double>,int>((int *)&this->gate_);
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }